

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

void __thiscall
cfg::tag_scalar_vector_t<cfgfile::string_trait_t>::tag_scalar_vector_t
          (tag_scalar_vector_t<cfgfile::string_trait_t> *this,tag_t<cfgfile::string_trait_t> *owner,
          string_t *name,bool is_mandatory)

{
  byte in_CL;
  tag_scalar_vector_t<int,_cfgfile::string_trait_t> *in_RDI;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  constraint_one_of_t<int> *in_stack_ffffffffffffff20;
  tag_t<cfgfile::string_trait_t> *in_stack_ffffffffffffff28;
  allocator *value;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *in_stack_ffffffffffffff30;
  constraint_one_of_t<int> *this_00;
  allocator local_a1;
  string local_a0 [32];
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  allocator local_71;
  string local_70 [32];
  string local_50 [55];
  byte local_19;
  
  local_19 = in_CL & 1;
  cfgfile::tag_scalar_vector_t<int,_cfgfile::string_trait_t>::tag_scalar_vector_t
            ((tag_scalar_vector_t<int,_cfgfile::string_trait_t> *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28,(string_t *)in_stack_ffffffffffffff20,
             (bool)in_stack_ffffffffffffff1f);
  (in_RDI->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t =
       (_func_int **)&PTR__tag_scalar_vector_t_00179c60;
  cfgfile::constraint_one_of_t<int>::constraint_one_of_t(in_stack_ffffffffffffff20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"string_field",&local_71);
  cfgfile::string_trait_t::from_ascii
            ((string *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  cfgfile::
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::tag_scalar_t(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 (string_t *)in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  this_00 = (constraint_one_of_t<int> *)
            &in_RDI[2].super_tag_t<cfgfile::string_trait_t>.m_child_tags.
             super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::constraint_one_of_t
            ((constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff20);
  local_78 = 100;
  cfgfile::constraint_one_of_t<int>::add_value(this_00,(int *)in_stack_ffffffffffffff28);
  local_7c = 200;
  cfgfile::constraint_one_of_t<int>::add_value(this_00,(int *)in_stack_ffffffffffffff28);
  local_80 = 300;
  cfgfile::constraint_one_of_t<int>::add_value(this_00,(int *)in_stack_ffffffffffffff28);
  cfgfile::tag_scalar_vector_t<int,_cfgfile::string_trait_t>::set_constraint
            (in_RDI,(constraint_t<int> *)(in_RDI + 1));
  value = &local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a0,
             "StringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringString"
             ,value);
  cfgfile::
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_value((constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value)
  ;
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  cfgfile::
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::set_constraint((tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
                    *)&in_RDI[1].super_tag_t<cfgfile::string_trait_t>.m_child_tags.
                       super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                   (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&in_RDI[2].super_tag_t<cfgfile::string_trait_t>.m_child_tags.
                       super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

tag_scalar_vector_t( cfgfile::tag_t< Trait > & owner, const typename Trait::string_t & name, bool is_mandatory )
		:	cfgfile::tag_scalar_vector_t< int, Trait >( owner, name, is_mandatory )
		,	m_string_field( *this, Trait::from_ascii( "string_field" ), true )
		,	m_string_field_constraint()
	{
		m_int_scalar_vector_constraint.add_value( 100 );
		m_int_scalar_vector_constraint.add_value( 200 );
		m_int_scalar_vector_constraint.add_value( 300 );
		this->set_constraint( &m_int_scalar_vector_constraint );

		m_string_field_constraint.add_value( "StringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringString" );
		m_string_field.set_constraint( &m_string_field_constraint );

	}